

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaWMR.cpp
# Opt level: O0

void __thiscall NaWMR::Function(NaWMR *this,NaReal *x,NaReal *y)

{
  long *plVar1;
  double *in_RDX;
  double *in_RSI;
  long *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int i;
  NaReal b;
  NaReal a;
  NaReal dt;
  int local_34;
  
  if ((in_RSI != (double *)0x0) && (in_RDX != (double *)0x0)) {
    plVar1 = (long *)(**(code **)(*in_RDI + 0x18))();
    dVar2 = (double)(**(code **)(*plVar1 + 8))();
    dVar4 = (double)in_RDI[4];
    dVar5 = (double)in_RDI[8];
    dVar3 = cos((double)in_RDI[6]);
    *in_RDX = dVar2 * dVar5 * dVar3 + dVar4;
    dVar4 = (double)in_RDI[5];
    dVar5 = (double)in_RDI[8];
    dVar3 = sin((double)in_RDI[6]);
    in_RDX[1] = dVar2 * dVar5 * dVar3 + dVar4;
    in_RDX[2] = dVar2 * (double)in_RDI[7] + (double)in_RDI[6];
    in_RDX[3] = dVar2 * (((double)in_RDI[0xc] * (double)in_RDI[0xe] * (double)in_RDI[7] *
                         (double)in_RDI[8]) / (double)in_RDI[0xf] +
                        ((double)in_RDI[0xb] * ((double)in_RDI[10] - (double)in_RDI[9])) /
                        ((double)in_RDI[0xd] * 2.0 * (double)in_RDI[0xf])) + (double)in_RDI[7];
    in_RDX[4] = dVar2 * (-(double)in_RDI[0xc] * (double)in_RDI[7] * (double)in_RDI[7] +
                        ((double)in_RDI[10] + (double)in_RDI[9]) /
                        ((double)in_RDI[0xe] * (double)in_RDI[0xd])) + (double)in_RDI[8];
    dVar4 = ((double)in_RDI[0x13] * (double)in_RDI[0x12] * (double)in_RDI[0x14]) /
            (double)in_RDI[0xb];
    dVar5 = ((double)in_RDI[7] * (double)in_RDI[0xb]) / 2.0;
    in_RDX[5] = dVar2 * (((double)in_RDI[0x13] * *in_RSI +
                         -(double)in_RDI[0x10] * (double)in_RDI[9] +
                         -(dVar4 * ((double)in_RDI[8] - dVar5))) / (double)in_RDI[0x11]) +
                (double)in_RDI[9];
    in_RDX[6] = dVar2 * (((double)in_RDI[0x13] * in_RSI[1] +
                         -(double)in_RDI[0x10] * (double)in_RDI[10] +
                         -(dVar4 * ((double)in_RDI[8] + dVar5))) / (double)in_RDI[0x11]) +
                (double)in_RDI[10];
    for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
      in_RDI[(long)local_34 + 4] = (long)in_RDX[local_34];
    }
  }
  return;
}

Assistant:

void
NaWMR::Function (NaReal* x, NaReal* y)
{
  if(NULL == x || NULL == y)
    return;

#if 1
#define NEXT(id, next)	y[id] = cs[id] + dt * (next)

  NaReal	dt = Timer().GetSamplingRate();

  NEXT(x_coord,
       cs[dir_vel] * cos(cs[angle]));
  NEXT(y_coord,
       cs[dir_vel] * sin(cs[angle]));
  NEXT(angle,
       cs[angle_vel]);
  NEXT(angle_vel,
       par.b * par.m * cs[angle_vel] * cs[dir_vel]/par.iz
       + par.l * (cs[right_torque] - cs[left_torque])/(2 * par.r * par.iz));
  NEXT(dir_vel,
       - par.b * cs[angle_vel] * cs[angle_vel]
       + (cs[right_torque] + cs[left_torque])/(par.m * par.r));

  NaReal	a = par.Km * par.Kw * par.i / par.l/* or par.r ??? some m */;
  NaReal	b = cs[angle_vel] * par.l / 2;
  NEXT(left_torque,
       (- par.R * cs[left_torque]
	- a * (cs[dir_vel] - b)
	+ par.Km * x[left_volts]) / par.L);
  NEXT(right_torque,
       (- par.R * cs[right_torque]
	- a * (cs[dir_vel] + b)
	+ par.Km * x[right_volts]) / par.L);

#undef NEXT

#else

  y[x_coord] = cs[x_coord] + dt * (cs[dir_vel] * cos(cs[angle]));
  y[y_coord] = cs[y_coord] + dt * (cs[dir_vel] * sin(cs[angle]));
  y[angle] = cs[angle] + dt * cs[angle_vel];
  y[angle_vel] = cs[angle_vel]
    + dt * (par.b * par.m * cs[angle_vel] * cs[dir_vel]/par.iz
	    + (cs[right_torque] - cs[left_torque])/(2 * par.r * par.iz));
  y[dir_vel] = cs[dir_vel]
    + dt * (-par.b * cs[angle_vel] * cs[angle_vel]
	    + (cs[right_torque] + cs[left_torque])/(par.m * par.r));

  NaReal	a = par.Km * par.Kw * par.i;
  NaReal	b = cs[angle_vel] * par.l / 2;
  y[left_torque] =
    cs[left_torque] + dt * (- par.R * cs[left_torque]
			    - a * (cs[dir_vel] - b)
			    + par.Km * x[left_volts]) / par.L;
  y[right_torque] =
    cs[right_torque] + dt * (- par.R * cs[right_torque]
			     - a * (cs[dir_vel] + b)
			     + par.Km * x[right_volts]) / par.L;
#endif

  for(int i = 0; i < __state_dim; ++i)
    cs[i] = y[i];
}